

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O1

void __thiscall QMessagePattern::setPattern(QMessagePattern *this,QString *pattern)

{
  undefined1 *puVar1;
  qsizetype *pqVar2;
  QChar ch;
  _Head_base<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_false> _Var3;
  bool bVar4;
  QRegularExpressionMatch QVar5;
  Data *pDVar6;
  QString *pQVar7;
  bool bVar8;
  int iVar9;
  char **ppcVar10;
  reference pvVar11;
  qsizetype qVar12;
  qlonglong qVar13;
  char **ppcVar14;
  ulong *puVar15;
  undefined8 extraout_RAX;
  byte bVar16;
  char *pcVar17;
  QString *formattedMessage;
  ulong uVar18;
  ulong uVar19;
  QMessageLogContext *context;
  QList<QString> *this_00;
  char16_t *pcVar20;
  QRegularExpressionMatchPrivate *data;
  ulong uVar21;
  int iVar22;
  long lVar23;
  long in_FS_OFFSET;
  QStringView QVar24;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QStringView string;
  QLatin1StringView str;
  QLatin1StringView str_00;
  QLatin1StringView str_01;
  QLatin1StringView rhs;
  QLatin1StringView rhs_00;
  QLatin1StringView rhs_01;
  QLatin1StringView rhs_02;
  QLatin1StringView rhs_03;
  QLatin1StringView rhs_04;
  QLatin1StringView rhs_05;
  QLatin1StringView rhs_06;
  QLatin1StringView rhs_07;
  QLatin1StringView rhs_08;
  QLatin1StringView rhs_09;
  QLatin1StringView rhs_10;
  QLatin1StringView rhs_11;
  QLatin1StringView rhs_12;
  QLatin1StringView rhs_13;
  QLatin1StringView rhs_14;
  QLatin1StringView rhs_15;
  QLatin1StringView rhs_16;
  QStringView lhs;
  QStringView lhs_00;
  QStringView lhs_01;
  QStringView lhs_02;
  QStringView lhs_03;
  QStringView lhs_04;
  QStringView lhs_05;
  QStringView lhs_06;
  QStringView lhs_07;
  QStringView lhs_08;
  QStringView lhs_09;
  QStringView lhs_10;
  QStringView lhs_11;
  QStringView lhs_12;
  QStringView lhs_13;
  QStringView lhs_14;
  QStringView lhs_15;
  QRegularExpressionMatch m;
  QRegularExpressionMatch local_120;
  QString local_118;
  QString local_f8;
  QString local_d8;
  vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  local_b8;
  QString local_98;
  QArrayDataPointer<QString> local_78;
  QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1Char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->timeArgs;
  QList<QString>::clear(this_00);
  QList<QMessagePattern::BacktraceParams>::clear(&this->backtraceArgs);
  this->maxBacktraceDepth = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  local_78.size = 0;
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (char16_t *)0x0;
  local_98.d.size = 0;
  uVar19 = (pattern->d).size;
  if (uVar19 != 0) {
    bVar16 = 0;
    uVar21 = 1;
    do {
      pcVar20 = (pattern->d).ptr;
      ch.ucs = pcVar20[uVar21 - 1];
      if ((((!(bool)(ch.ucs != L'%' | bVar16)) && (uVar21 < uVar19)) && (pcVar20[uVar21] == L'{'))
         && (bVar16 = 1, local_98.d.size != 0)) {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_98);
        QList<QString>::end((QList<QString> *)&local_78);
        pDVar6 = local_98.d.d;
        if (local_98.d.ptr != (char16_t *)0x0) {
          local_98.d.d = (Data *)0x0;
          local_98.d.ptr = (char16_t *)0x0;
          local_98.d.size = 0;
          if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
            }
          }
        }
      }
      QString::append(&local_98,ch);
      if ((bool)(ch.ucs == L'}' & bVar16)) {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_98);
        QList<QString>::end((QList<QString> *)&local_78);
        pDVar6 = local_98.d.d;
        if (local_98.d.ptr != (char16_t *)0x0) {
          local_98.d.d = (Data *)0x0;
          local_98.d.ptr = (char16_t *)0x0;
          local_98.d.size = 0;
          if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
            }
          }
        }
        bVar16 = 0;
      }
      uVar19 = (pattern->d).size;
      bVar4 = uVar21 < uVar19;
      uVar21 = uVar21 + 1;
    } while (bVar4);
  }
  if (local_98.d.size != 0) {
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_98);
    QList<QString>::end((QList<QString> *)&local_78);
  }
  local_b8.
  super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)0x0;
  local_b8.
  super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)0x0;
  local_b8.
  super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppcVar10 = (char **)operator_new__(local_78.size * 8 + 8);
  ppcVar14 = (this->tokens)._M_t.
             super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
             super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
             super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
  (this->tokens)._M_t.super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t
  .super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl = ppcVar10;
  if (ppcVar14 != (char **)0x0) {
    operator_delete__(ppcVar14);
  }
  ppcVar14 = (this->tokens)._M_t.
             super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
             super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
             super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
  if (ppcVar14 == (char **)0x0) {
LAB_00212b00:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00213002;
    setPattern();
  }
  else {
    bVar4 = false;
    ppcVar14[local_78.size] = (char *)0x0;
    local_d8.d.d = (Data *)0x0;
    local_d8.d.ptr = (char16_t *)0x0;
    local_d8.d.size = 0;
    if (local_78.size != 0) {
      lVar23 = 2;
      uVar19 = 0;
      bVar16 = 0;
      bVar4 = false;
LAB_00211c46:
      local_f8.d.d = *(Data **)((long)local_78.ptr + lVar23 * 8 + -0x10);
      local_f8.d.ptr = *(char16_t **)((long)local_78.ptr + lVar23 * 8 + -8);
      local_f8.d.size = (qsizetype)(&((local_78.ptr)->d).d)[lVar23];
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      s.m_data = "%{";
      s.m_size = 2;
      bVar8 = QString::startsWith(&local_f8,s,CaseSensitive);
      if ((!bVar8) ||
         (bVar8 = QString::endsWith(&local_f8,(QChar)0x7d,CaseSensitive), qVar12 = local_f8.d.size,
         !bVar8)) {
        QString::toLatin1_helper((QByteArray *)&local_58,&local_f8);
        pcVar20 = (char16_t *)local_58.a.a.m_data;
        if ((char16_t *)local_58.a.a.m_data == (char16_t *)0x0) {
          pcVar20 = (char16_t *)"";
        }
        local_118.d.d = (Data *)qstrdup((char *)pcVar20);
        pvVar11 = std::
                  vector<std::unique_ptr<char_const[],std::default_delete<char_const[]>>,std::allocator<std::unique_ptr<char_const[],std::default_delete<char_const[]>>>>
                  ::emplace_back<std::unique_ptr<char[],std::default_delete<char[]>>>
                            ((vector<std::unique_ptr<char_const[],std::default_delete<char_const[]>>,std::allocator<std::unique_ptr<char_const[],std::default_delete<char_const[]>>>>
                              *)&local_b8,
                             (unique_ptr<char[],_std::default_delete<char[]>_> *)&local_118);
        ppcVar14 = (this->tokens)._M_t.
                   super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                   super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                   super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
        if (ppcVar14 == (char **)0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00213002;
          setPattern();
          goto LAB_00212b00;
        }
        ppcVar14[uVar19] =
             (pvVar11->_M_t).super___uniq_ptr_impl<const_char,_std::default_delete<const_char[]>_>.
             _M_t.super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char[]>_>.
             super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
        if ((QRegularExpressionMatchPrivate *)local_118.d.d != (QRegularExpressionMatchPrivate *)0x0
           ) {
          operator_delete__(local_118.d.d);
        }
        local_118.d.d = (Data *)0x0;
        if ((QRegularExpressionMatchPrivate *)local_58.a.a.m_size ==
            (QRegularExpressionMatchPrivate *)0x0) goto LAB_00212084;
        LOCK();
        (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i != 0)
        goto LAB_00212084;
        qVar12 = 1;
        data = (QRegularExpressionMatchPrivate *)local_58.a.a.m_size;
LAB_00211dad:
        QArrayData::deallocate((QArrayData *)data,qVar12,0x10);
        goto LAB_00212084;
      }
      puVar1 = (undefined1 *)
               ((long)&(((Data *)(local_f8.d.size + -0x10))->super_QArrayData).alloc + 2);
      switch(puVar1) {
      case (undefined1 *)0x0:
switchD_00211cdb_caseD_0:
        rhs.m_data = "%{pid}";
        rhs.m_size = 6;
        lhs.m_data = local_f8.d.ptr;
        lhs.m_size = qVar12;
        bVar8 = QtPrivate::equalStrings(lhs,rhs);
        if (bVar8) {
          ppcVar14 = (this->tokens)._M_t.
                     super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                     super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
          if (ppcVar14 != (char **)0x0) {
            pcVar17 = "%{pid}";
            goto LAB_00212076;
          }
          goto LAB_00212b70;
        }
        if ((Data *)qVar12 == (Data *)0xd) goto switchD_00211cdb_caseD_7;
        if ((Data *)qVar12 == (Data *)0xb) goto switchD_00211fc2_caseD_5;
        if ((Data *)qVar12 == (Data *)0xa) goto switchD_00211ecf_caseD_4;
        break;
      case (undefined1 *)0x1:
        rhs_00.m_data = "%{type}";
        rhs_00.m_size = 7;
        QVar24.m_data = local_f8.d.ptr;
        QVar24.m_size = local_f8.d.size;
        bVar8 = QtPrivate::equalStrings(QVar24,rhs_00);
        if (bVar8) {
          ppcVar14 = (this->tokens)._M_t.
                     super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                     super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
          if (ppcVar14 != (char **)0x0) {
            pcVar17 = "%{type}";
            goto LAB_00212076;
          }
          goto LAB_00212be0;
        }
        switch(puVar1) {
        case (undefined1 *)0x0:
          goto switchD_00211cdb_caseD_0;
        case (undefined1 *)0x1:
          goto switchD_00211e7e_caseD_1;
        case (undefined1 *)0x4:
          goto switchD_00211cdb_caseD_4;
        case (undefined1 *)0x5:
          goto switchD_00211cdb_caseD_5;
        case (undefined1 *)0x7:
          goto switchD_00211cdb_caseD_7;
        }
        break;
      case (undefined1 *)0x4:
switchD_00211cdb_caseD_4:
        rhs_02.m_data = "%{message}";
        rhs_02.m_size = 10;
        lhs_01.m_data = local_f8.d.ptr;
        lhs_01.m_size = qVar12;
        bVar8 = QtPrivate::equalStrings(lhs_01,rhs_02);
        if (bVar8) {
          ppcVar14 = (this->tokens)._M_t.
                     super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                     super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
          if (ppcVar14 != (char **)0x0) {
            pcVar17 = "%{message}";
            goto LAB_00212076;
          }
          goto LAB_00212b8c;
        }
        switch(puVar1) {
        case (undefined1 *)0x0:
          goto switchD_00211cdb_caseD_0;
        case (undefined1 *)0x1:
switchD_00211e7e_caseD_1:
          rhs_03.m_data = "%{file}";
          rhs_03.m_size = 7;
          lhs_02.m_data = local_f8.d.ptr;
          lhs_02.m_size = qVar12;
          bVar8 = QtPrivate::equalStrings(lhs_02,rhs_03);
          if (bVar8) {
            ppcVar14 = (this->tokens)._M_t.
                       super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                       super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
            if (ppcVar14 != (char **)0x0) {
              pcVar17 = "%{file}";
              goto LAB_00212076;
            }
            goto LAB_00212c50;
          }
          switch(puVar1) {
          case (undefined1 *)0x0:
            goto switchD_00211cdb_caseD_0;
          case (undefined1 *)0x1:
            rhs_04.m_data = "%{line}";
            rhs_04.m_size = 7;
            lhs_03.m_data = local_f8.d.ptr;
            lhs_03.m_size = qVar12;
            bVar8 = QtPrivate::equalStrings(lhs_03,rhs_04);
            if (bVar8) {
              ppcVar14 = (this->tokens)._M_t.
                         super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>
                         .super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
              if (ppcVar14 != (char **)0x0) {
                pcVar17 = "%{line}";
                goto LAB_00212076;
              }
              goto LAB_00212d68;
            }
            switch(puVar1) {
            case (undefined1 *)0x0:
              goto switchD_00211cdb_caseD_0;
            case (undefined1 *)0x4:
              goto switchD_00211ecf_caseD_4;
            case (undefined1 *)0x5:
              goto switchD_00211e7e_caseD_5;
            case (undefined1 *)0x7:
              goto switchD_00211cdb_caseD_7;
            }
            break;
          case (undefined1 *)0x4:
            goto switchD_00211ecf_caseD_4;
          case (undefined1 *)0x5:
            goto switchD_00211e7e_caseD_5;
          case (undefined1 *)0x7:
            goto switchD_00211cdb_caseD_7;
          }
          break;
        case (undefined1 *)0x4:
switchD_00211ecf_caseD_4:
          rhs_06.m_data = "%{appname}";
          rhs_06.m_size = 10;
          lhs_05.m_data = local_f8.d.ptr;
          lhs_05.m_size = qVar12;
          bVar8 = QtPrivate::equalStrings(lhs_05,rhs_06);
          if (bVar8) {
            ppcVar14 = (this->tokens)._M_t.
                       super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                       super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
            if (ppcVar14 != (char **)0x0) {
              pcVar17 = "%{appname}";
              goto LAB_00212076;
            }
            goto LAB_00212c34;
          }
          if ((Data *)qVar12 == (Data *)0xd) goto switchD_00211cdb_caseD_7;
          if ((Data *)qVar12 == (Data *)0xb) goto switchD_00211fc2_caseD_5;
          break;
        case (undefined1 *)0x5:
switchD_00211e7e_caseD_5:
          rhs_05.m_data = "%{function}";
          rhs_05.m_size = 0xb;
          lhs_04.m_data = local_f8.d.ptr;
          lhs_04.m_size = qVar12;
          bVar8 = QtPrivate::equalStrings(lhs_04,rhs_05);
          if (!bVar8) {
            switch(puVar1) {
            case (undefined1 *)0x0:
              goto switchD_00211cdb_caseD_0;
            default:
              goto switchD_00211cdb_caseD_2;
            case (undefined1 *)0x4:
              goto switchD_00211ecf_caseD_4;
            case (undefined1 *)0x5:
              goto switchD_00211fc2_caseD_5;
            case (undefined1 *)0x7:
              goto switchD_00211cdb_caseD_7;
            }
          }
          ppcVar14 = (this->tokens)._M_t.
                     super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                     super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
          if (ppcVar14 != (char **)0x0) {
            pcVar17 = "%{function}";
            goto LAB_00212076;
          }
          goto LAB_00212c88;
        case (undefined1 *)0x7:
          goto switchD_00211cdb_caseD_7;
        }
        break;
      case (undefined1 *)0x5:
switchD_00211cdb_caseD_5:
        rhs_01.m_data = "%{category}";
        rhs_01.m_size = 0xb;
        lhs_00.m_data = local_f8.d.ptr;
        lhs_00.m_size = qVar12;
        bVar8 = QtPrivate::equalStrings(lhs_00,rhs_01);
        if (bVar8) {
          ppcVar14 = (this->tokens)._M_t.
                     super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                     super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
          if (ppcVar14 != (char **)0x0) {
            pcVar17 = "%{category}";
            goto LAB_00212076;
          }
          goto LAB_00212bc4;
        }
        switch(puVar1) {
        case (undefined1 *)0x0:
          goto switchD_00211cdb_caseD_0;
        case (undefined1 *)0x1:
          goto switchD_00211e7e_caseD_1;
        case (undefined1 *)0x4:
          goto switchD_00211cdb_caseD_4;
        case (undefined1 *)0x5:
          goto switchD_00211e7e_caseD_5;
        case (undefined1 *)0x7:
          goto switchD_00211cdb_caseD_7;
        }
        break;
      case (undefined1 *)0x7:
switchD_00211cdb_caseD_7:
        rhs_08.m_data = "%{threadname}";
        rhs_08.m_size = 0xd;
        lhs_07.m_data = local_f8.d.ptr;
        lhs_07.m_size = qVar12;
        bVar8 = QtPrivate::equalStrings(lhs_07,rhs_08);
        if (bVar8) {
          ppcVar14 = (this->tokens)._M_t.
                     super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                     super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
          if (ppcVar14 == (char **)0x0) goto LAB_00212b54;
          pcVar17 = "%{threadname}";
        }
        else {
          if (((Data *)qVar12 != (Data *)0xd) ||
             (rhs_09.m_data = "%{qthreadptr}", rhs_09.m_size = 0xd, lhs_08.m_data = local_f8.d.ptr,
             lhs_08.m_size = 0xd, bVar8 = QtPrivate::equalStrings(lhs_08,rhs_09), !bVar8)) break;
          ppcVar14 = (this->tokens)._M_t.
                     super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                     super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
          if (ppcVar14 == (char **)0x0) goto LAB_00212c18;
          pcVar17 = "%{qthreadptr}";
        }
LAB_00212076:
        ppcVar14[uVar19] = pcVar17;
        goto LAB_00212084;
      }
      goto switchD_00211cdb_caseD_2;
    }
    bVar16 = 0;
LAB_0021295c:
    if (bVar4 || bVar16 != 0) {
      pcVar17 = "QT_MESSAGE_PATTERN: missing %{endif}\n";
      if (bVar16 != 0) {
        pcVar17 = "QT_MESSAGE_PATTERN: %{if-*} cannot be nested\n";
      }
      str_01.m_data = pcVar17;
      str_01.m_size = (ulong)bVar16 * 8 + 0x25;
      QString::append(&local_d8,str_01);
    }
    if (local_d8.d.size != 0) {
      context = (QMessageLogContext *)0x1;
      QString::chop(&local_d8,1);
      stderr_message_handler((QtMsgType)&local_d8,context,formattedMessage);
    }
    lVar23 = (long)local_b8.
                   super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b8.
                   super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
    uVar19 = lVar23 + 1;
    lVar23 = lVar23 * 8;
    uVar21 = lVar23 + 8;
    uVar18 = 0xffffffffffffffff;
    if (uVar21 < 0xfffffffffffffff8) {
      uVar18 = lVar23 + 0x10;
    }
    puVar15 = (ulong *)operator_new__(-(ulong)(uVar19 >> 0x3d != 0) | uVar18);
    *puVar15 = uVar19;
    if (uVar19 != 0) {
      uVar19 = 0;
      do {
        *(undefined8 *)
         ((long)&((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)(puVar15 + 1))->
                 _M_t + uVar19) = 0;
        uVar19 = uVar19 + 8;
      } while (uVar21 != uVar19);
    }
    _Var3._M_head_impl =
         (this->literals)._M_t.
         super___uniq_ptr_impl<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
         .
         super__Head_base<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_false>
         ._M_head_impl;
    (this->literals)._M_t.
    super___uniq_ptr_impl<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
    .
    super__Head_base<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_false>
    ._M_head_impl = (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)(puVar15 + 1);
    if (_Var3._M_head_impl != (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)0x0) {
      std::default_delete<std::unique_ptr<char_const[],std::default_delete<char_const[]>>[]>::
      operator()((default_delete<std::unique_ptr<char_const[],std::default_delete<char_const[]>>[]>
                  *)this,_Var3._M_head_impl);
    }
    _Var3._M_head_impl =
         (this->literals)._M_t.
         super___uniq_ptr_impl<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
         .
         super__Head_base<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_false>
         ._M_head_impl;
    if (_Var3._M_head_impl != (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)0x0) {
      std::__copy_move<true,false,std::random_access_iterator_tag>::
      __copy_m<std::unique_ptr<char_const[],std::default_delete<char_const[]>>*,std::unique_ptr<char_const[],std::default_delete<char_const[]>>*>
                (local_b8.
                 super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_b8.
                 super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,_Var3._M_head_impl);
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
      std::
      vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
      ::~vector(&local_b8);
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      goto LAB_00213002;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    setPattern();
LAB_00212b38:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      setPattern();
LAB_00212b54:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        setPattern();
LAB_00212b70:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          setPattern();
LAB_00212b8c:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            setPattern();
LAB_00212ba8:
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              setPattern();
LAB_00212bc4:
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                setPattern();
LAB_00212be0:
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  setPattern();
LAB_00212bfc:
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    setPattern();
LAB_00212c18:
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      setPattern();
LAB_00212c34:
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        setPattern();
LAB_00212c50:
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          setPattern();
LAB_00212c6c:
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            setPattern();
LAB_00212c88:
                            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                              setPattern();
LAB_00212ca4:
                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                setPattern();
LAB_00212cc0:
                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                  setPattern();
LAB_00212cdc:
                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                    setPattern();
LAB_00212cf8:
                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                      setPattern();
LAB_00212d14:
                                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                        setPattern();
LAB_00212d30:
                                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                          setPattern();
LAB_00212d4c:
                                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                            setPattern();
LAB_00212d68:
                                            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                              setPattern();
                                              if ((QRegularExpressionMatchPrivate *)
                                                  local_58.a.a.m_size !=
                                                  (QRegularExpressionMatchPrivate *)0x0) {
                                                setPattern();
                                              }
                                              __cxa_guard_abort(&setPattern(QString_const&)::
                                                                 separatorRx);
                                              if ((QRegularExpressionMatchPrivate *)local_118.d.d !=
                                                  (QRegularExpressionMatchPrivate *)0x0) {
                                                LOCK();
                                                ((local_118.d.d)->super_QArrayData).ref_._q_value.
                                                super___atomic_base<int>._M_i =
                                                     ((local_118.d.d)->super_QArrayData).ref_.
                                                     _q_value.super___atomic_base<int>._M_i + -1;
                                                UNLOCK();
                                                if (((local_118.d.d)->super_QArrayData).ref_.
                                                    _q_value.super___atomic_base<int>._M_i == 0) {
                                                  QArrayData::deallocate
                                                            (&(local_118.d.d)->super_QArrayData,2,
                                                             0x10);
                                                }
                                              }
                                              if (&(local_f8.d.d)->super_QArrayData !=
                                                  (QArrayData *)0x0) {
                                                LOCK();
                                                ((local_f8.d.d)->super_QArrayData).ref_._q_value.
                                                super___atomic_base<int>._M_i =
                                                     ((local_f8.d.d)->super_QArrayData).ref_.
                                                     _q_value.super___atomic_base<int>._M_i + -1;
                                                UNLOCK();
                                                if (((local_f8.d.d)->super_QArrayData).ref_._q_value
                                                    .super___atomic_base<int>._M_i == 0) {
                                                  QArrayData::deallocate
                                                            (&(local_f8.d.d)->super_QArrayData,2,
                                                             0x10);
                                                }
                                              }
                                              if (&(local_d8.d.d)->super_QArrayData !=
                                                  (QArrayData *)0x0) {
                                                LOCK();
                                                ((local_d8.d.d)->super_QArrayData).ref_._q_value.
                                                super___atomic_base<int>._M_i =
                                                     ((local_d8.d.d)->super_QArrayData).ref_.
                                                     _q_value.super___atomic_base<int>._M_i + -1;
                                                UNLOCK();
                                                if (((local_d8.d.d)->super_QArrayData).ref_._q_value
                                                    .super___atomic_base<int>._M_i == 0) {
                                                  QArrayData::deallocate
                                                            (&(local_d8.d.d)->super_QArrayData,2,
                                                             0x10);
                                                }
                                              }
                                              std::
                                              vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
                                              ::~vector(&local_b8);
                                              if (&(local_98.d.d)->super_QArrayData !=
                                                  (QArrayData *)0x0) {
                                                LOCK();
                                                ((local_98.d.d)->super_QArrayData).ref_._q_value.
                                                super___atomic_base<int>._M_i =
                                                     ((local_98.d.d)->super_QArrayData).ref_.
                                                     _q_value.super___atomic_base<int>._M_i + -1;
                                                UNLOCK();
                                                if (((local_98.d.d)->super_QArrayData).ref_._q_value
                                                    .super___atomic_base<int>._M_i == 0) {
                                                  QArrayData::deallocate
                                                            (&(local_98.d.d)->super_QArrayData,2,
                                                             0x10);
                                                }
                                              }
                                              QArrayDataPointer<QString>::~QArrayDataPointer
                                                        (&local_78);
                                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                                _Unwind_Resume(extraout_RAX);
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00213002:
  __stack_chk_fail();
switchD_00211fc2_caseD_5:
  rhs_07.m_data = "%{threadid}";
  rhs_07.m_size = 0xb;
  lhs_06.m_data = local_f8.d.ptr;
  lhs_06.m_size = qVar12;
  bVar8 = QtPrivate::equalStrings(lhs_06,rhs_07);
  if (bVar8) {
    ppcVar14 = (this->tokens)._M_t.
               super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
               super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
               super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    if (ppcVar14 != (char **)0x0) {
      pcVar17 = "%{threadid}";
      goto LAB_00212076;
    }
    goto LAB_00212c6c;
  }
  if ((Data *)qVar12 == (Data *)0xd) goto switchD_00211cdb_caseD_7;
switchD_00211cdb_caseD_2:
  s_00.m_data = "%{time";
  s_00.m_size = 6;
  bVar8 = QString::startsWith(&local_f8,s_00,CaseSensitive);
  if (bVar8) {
    ppcVar14 = (this->tokens)._M_t.
               super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
               super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
               super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    if (ppcVar14 == (char **)0x0) goto LAB_00212b38;
    ppcVar14[uVar19] = "%{time";
    qVar12 = QString::indexOf(&local_f8,(QChar)0x20,0,CaseSensitive);
    if (qVar12 < 1) {
      local_58.a.a.m_size = 0;
      local_58.a.a.m_data = (char *)0x0;
      local_58.a.b = (QString *)0x0;
      QList<QString>::append(this_00,(rvalue_ref)&local_58);
    }
    else {
      QString::mid((QString *)&local_58,&local_f8,qVar12 + 1,local_f8.d.size + (-2 - qVar12));
      QList<QString>::append(this_00,(rvalue_ref)&local_58);
    }
    if ((QRegularExpressionMatchPrivate *)local_58.a.a.m_size !=
        (QRegularExpressionMatchPrivate *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      iVar9 = (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i;
      UNLOCK();
      data = (QRegularExpressionMatchPrivate *)local_58.a.a.m_size;
joined_r0x00212408:
      if (iVar9 == 0) {
        qVar12 = 2;
        goto LAB_00211dad;
      }
    }
  }
  else {
    s_01.m_data = "%{backtrace";
    s_01.m_size = 0xb;
    bVar8 = QString::startsWith(&local_f8,s_01,CaseSensitive);
    qVar12 = local_f8.d.size;
    if (bVar8) {
      ppcVar14 = (this->tokens)._M_t.
                 super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                 super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                 super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
      if (ppcVar14 == (char **)0x0) goto LAB_00212ba8;
      ppcVar14[uVar19] = "%{backtrace";
      local_118.d.d = (Data *)0x0;
      local_118.d.ptr = L"|";
      local_118.d.size = 1;
      if ((setPattern(QString_const&)::depthRx == '\0') &&
         (iVar9 = __cxa_guard_acquire(&setPattern(QString_const&)::depthRx), iVar9 != 0)) {
        local_58.a.a.m_size = 0;
        local_58.a.a.m_data = " depth=(?|\"([^\"]*)\"|([^ }]*))";
        local_58.a.b = (QString *)0x1d;
        QRegularExpression::QRegularExpression
                  (&setPattern::depthRx,(QString *)&local_58,(PatternOptions)0x0);
        if ((QRegularExpressionMatchPrivate *)local_58.a.a.m_size !=
            (QRegularExpressionMatchPrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate((QArrayData *)local_58.a.a.m_size,2,0x10);
          }
        }
        __cxa_atexit(QRegularExpression::~QRegularExpression,&setPattern::depthRx,&__dso_handle);
        __cxa_guard_release(&setPattern(QString_const&)::depthRx);
      }
      if ((setPattern(QString_const&)::separatorRx == '\0') &&
         (iVar9 = __cxa_guard_acquire(&setPattern(QString_const&)::separatorRx), iVar9 != 0)) {
        local_58.a.a.m_size = 0;
        local_58.a.a.m_data = " separator=(?|\"([^\"]*)\"|([^ }]*))";
        local_58.a.b = (QString *)0x21;
        QRegularExpression::QRegularExpression
                  (&setPattern::separatorRx,(QString *)&local_58,(PatternOptions)0x0);
        if ((QRegularExpressionMatchPrivate *)local_58.a.a.m_size !=
            (QRegularExpressionMatchPrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate((QArrayData *)local_58.a.a.m_size,2,0x10);
          }
        }
        __cxa_atexit(QRegularExpression::~QRegularExpression,&setPattern::separatorRx,&__dso_handle)
        ;
        __cxa_guard_release(&setPattern(QString_const&)::separatorRx);
      }
      local_120.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      iVar9 = 0;
      QRegularExpression::match
                ((QRegularExpression *)&local_120,(QString *)&setPattern::depthRx,
                 (qsizetype)&local_f8,NormalMatch,(MatchOptions)0x0);
      bVar8 = QRegularExpressionMatch::hasMatch(&local_120);
      iVar22 = 5;
      if (bVar8) {
        QVar24 = QRegularExpressionMatch::capturedView(&local_120,1);
        string.m_data = (storage_type_conflict *)0x0;
        string.m_size = (qsizetype)QVar24.m_data;
        qVar13 = QString::toIntegral_helper((QString *)QVar24.m_size,string,(bool *)0xa,iVar9);
        if ((int)qVar13 != qVar13) {
          qVar13 = 0;
        }
        iVar22 = (int)qVar13;
        if (iVar22 < 1) {
          str.m_data = "QT_MESSAGE_PATTERN: %{backtrace} depth must be a number greater than 0\n";
          str.m_size = 0x47;
          QString::append(&local_d8,str);
          iVar22 = 5;
        }
      }
      QRegularExpression::match
                ((QRegularExpression *)&local_58,(QString *)&setPattern::separatorRx,
                 (qsizetype)&local_f8,NormalMatch,(MatchOptions)0x0);
      QVar5.d.d.ptr = local_120.d.d.ptr;
      local_120.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)local_58.a.a.m_size;
      local_58.a.a.m_size = (qsizetype)QVar5.d.d.ptr;
      QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_58);
      bVar8 = QRegularExpressionMatch::hasMatch(&local_120);
      if (bVar8) {
        QRegularExpressionMatch::captured((QString *)&local_58,&local_120,1);
        pQVar7 = local_58.a.b;
        qVar12 = local_58.a.a.m_size;
        pcVar20 = local_118.d.ptr;
        pDVar6 = local_118.d.d;
        local_58.a.a.m_size = (qsizetype)local_118.d.d;
        local_118.d.d = (Data *)qVar12;
        local_118.d.ptr = (char16_t *)local_58.a.a.m_data;
        local_58.a.a.m_data = (char *)pcVar20;
        local_58.a.b = (QString *)local_118.d.size;
        local_118.d.size = (qsizetype)pQVar7;
        if ((QRegularExpressionMatchPrivate *)pDVar6 != (QRegularExpressionMatchPrivate *)0x0) {
          LOCK();
          (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
          }
        }
      }
      local_58.a.a.m_size = 0;
      local_58.a.a.m_data = (char *)0x0;
      local_58.a.b = (QString *)0x0;
      local_58._28_4_ = 0xaaaaaaaa;
      local_58._24_4_ = iVar22;
      QString::operator=((QString *)&local_58,&local_118);
      QList<QMessagePattern::BacktraceParams>::append
                (&this->backtraceArgs,(parameter_type)&local_58);
      iVar9 = this->maxBacktraceDepth;
      if (this->maxBacktraceDepth <= iVar22) {
        iVar9 = iVar22;
      }
      this->maxBacktraceDepth = iVar9;
      if ((QRegularExpressionMatchPrivate *)local_58.a.a.m_size !=
          (QRegularExpressionMatchPrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate((QArrayData *)local_58.a.a.m_size,2,0x10);
        }
      }
      QRegularExpressionMatch::~QRegularExpressionMatch(&local_120);
      if ((QRegularExpressionMatchPrivate *)local_118.d.d != (QRegularExpressionMatchPrivate *)0x0)
      {
        LOCK();
        ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        iVar9 = ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        data = (QRegularExpressionMatchPrivate *)local_118.d.d;
        goto joined_r0x00212408;
      }
    }
    else {
      pqVar2 = &(((Data *)(local_f8.d.size + -0x10))->super_QArrayData).alloc;
      switch(pqVar2) {
      case (qsizetype *)0x0:
switchD_00212439_caseD_0:
        rhs_10.m_data = "%{endif}";
        rhs_10.m_size = 8;
        lhs_09.m_data = local_f8.d.ptr;
        lhs_09.m_size = qVar12;
        bVar8 = QtPrivate::equalStrings(lhs_09,rhs_10);
        if (bVar8) {
          ppcVar14 = (this->tokens)._M_t.
                     super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                     super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
          if (ppcVar14 != (char **)0x0) {
            ppcVar14[uVar19] = "%{endif}";
            if ((!bVar4) && (bVar16 == 0)) {
              str_00.m_data = "QT_MESSAGE_PATTERN: %{endif} without an %{if-*}\n";
              str_00.m_size = 0x30;
              QString::append(&local_d8,str_00);
            }
            bVar4 = false;
            goto LAB_00212084;
          }
          goto LAB_00212ca4;
        }
        break;
      case (qsizetype *)0x2:
switchD_00212439_caseD_2:
        rhs_13.m_data = "%{if-info}";
        rhs_13.m_size = 10;
        lhs_12.m_data = local_f8.d.ptr;
        lhs_12.m_size = qVar12;
        bVar8 = QtPrivate::equalStrings(lhs_12,rhs_13);
        if (bVar8) {
          ppcVar14 = (this->tokens)._M_t.
                     super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                     super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
          if (ppcVar14 != (char **)0x0) {
            if (bVar4) {
              bVar16 = 1;
            }
            pcVar17 = "%{if-info}";
            goto LAB_00212771;
          }
          goto LAB_00212cdc;
        }
        switch(pqVar2) {
        case (qsizetype *)0x0:
          goto switchD_00212439_caseD_0;
        case (qsizetype *)0x3:
switchD_002125e1_caseD_3:
          rhs_16.m_data = "%{if-fatal}";
          rhs_16.m_size = 0xb;
          lhs_15.m_data = local_f8.d.ptr;
          lhs_15.m_size = qVar12;
          bVar8 = QtPrivate::equalStrings(lhs_15,rhs_16);
          if (bVar8) {
            ppcVar14 = (this->tokens)._M_t.
                       super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                       super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
            if (ppcVar14 != (char **)0x0) {
              if (bVar4) {
                bVar16 = 1;
              }
              pcVar17 = "%{if-fatal}";
              goto LAB_00212771;
            }
            goto LAB_00212d4c;
          }
          if ((Data *)qVar12 == (Data *)0x8) goto switchD_00212439_caseD_0;
          break;
        case (qsizetype *)0x5:
          goto switchD_00212439_caseD_5;
        case (qsizetype *)0x6:
switchD_00212572_caseD_6:
          rhs_15.m_data = "%{if-critical}";
          rhs_15.m_size = 0xe;
          lhs_14.m_data = local_f8.d.ptr;
          lhs_14.m_size = qVar12;
          bVar8 = QtPrivate::equalStrings(lhs_14,rhs_15);
          if (bVar8) {
            ppcVar14 = (this->tokens)._M_t.
                       super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                       super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
            if (ppcVar14 != (char **)0x0) {
              if (bVar4) {
                bVar16 = 1;
              }
              pcVar17 = "%{if-critical}";
              goto LAB_00212771;
            }
            goto LAB_00212d30;
          }
          if ((Data *)qVar12 == (Data *)0x8) goto switchD_00212439_caseD_0;
          if ((Data *)qVar12 == (Data *)0xb) goto switchD_002125e1_caseD_3;
        }
        break;
      case (qsizetype *)0x3:
switchD_00212439_caseD_3:
        rhs_12.m_data = "%{if-debug}";
        rhs_12.m_size = 0xb;
        lhs_11.m_data = local_f8.d.ptr;
        lhs_11.m_size = qVar12;
        bVar8 = QtPrivate::equalStrings(lhs_11,rhs_12);
        if (bVar8) {
          ppcVar14 = (this->tokens)._M_t.
                     super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                     super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
          if (ppcVar14 != (char **)0x0) {
            if (bVar4) {
              bVar16 = 1;
            }
            pcVar17 = "%{if-debug}";
            goto LAB_00212771;
          }
          goto LAB_00212cf8;
        }
        switch(pqVar2) {
        case (qsizetype *)0x0:
          goto switchD_00212439_caseD_0;
        case (qsizetype *)0x2:
          goto switchD_00212439_caseD_2;
        case (qsizetype *)0x3:
          goto switchD_002125e1_caseD_3;
        case (qsizetype *)0x5:
          goto switchD_00212439_caseD_5;
        case (qsizetype *)0x6:
          goto switchD_00212572_caseD_6;
        }
        break;
      case (qsizetype *)0x5:
switchD_00212439_caseD_5:
        rhs_14.m_data = "%{if-warning}";
        rhs_14.m_size = 0xd;
        lhs_13.m_data = local_f8.d.ptr;
        lhs_13.m_size = qVar12;
        bVar8 = QtPrivate::equalStrings(lhs_13,rhs_14);
        if (bVar8) {
          ppcVar14 = (this->tokens)._M_t.
                     super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                     super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
          if (ppcVar14 != (char **)0x0) {
            if (bVar4) {
              bVar16 = 1;
            }
            pcVar17 = "%{if-warning}";
LAB_00212771:
            ppcVar14[uVar19] = pcVar17;
            bVar4 = true;
            goto LAB_00212084;
          }
          goto LAB_00212cc0;
        }
        if ((Data *)qVar12 == (Data *)0x8) goto switchD_00212439_caseD_0;
        if ((Data *)qVar12 == (Data *)0xb) goto switchD_002125e1_caseD_3;
        if ((Data *)qVar12 == (Data *)0xe) goto switchD_00212572_caseD_6;
        break;
      case (qsizetype *)0x6:
        rhs_11.m_data = "%{if-category}";
        rhs_11.m_size = 0xe;
        lhs_10.m_data = local_f8.d.ptr;
        lhs_10.m_size = local_f8.d.size;
        bVar8 = QtPrivate::equalStrings(lhs_10,rhs_11);
        if (bVar8) {
          ppcVar14 = (this->tokens)._M_t.
                     super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                     super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
          if (ppcVar14 != (char **)0x0) {
            if (bVar4) {
              bVar16 = 1;
            }
            pcVar17 = "%{if-category}";
            goto LAB_00212771;
          }
          goto LAB_00212d14;
        }
        switch(pqVar2) {
        case (qsizetype *)0x0:
          goto switchD_00212439_caseD_0;
        case (qsizetype *)0x2:
          goto switchD_00212439_caseD_2;
        case (qsizetype *)0x3:
          goto switchD_00212439_caseD_3;
        case (qsizetype *)0x5:
          goto switchD_00212439_caseD_5;
        case (qsizetype *)0x6:
          goto switchD_00212572_caseD_6;
        }
      }
      ppcVar14 = (this->tokens)._M_t.
                 super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                 super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                 super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
      if (ppcVar14 == (char **)0x0) goto LAB_00212bfc;
      ppcVar14[uVar19] = "";
      local_58.a.a.m_size = 0x28;
      local_58.a.a.m_data = "QT_MESSAGE_PATTERN: Unknown placeholder ";
      local_58.a.b = &local_f8;
      local_58.b.ch = '\n';
      ::operator+=(&local_d8,&local_58);
    }
  }
LAB_00212084:
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  uVar19 = uVar19 + 1;
  lVar23 = lVar23 + 3;
  if ((ulong)local_78.size <= uVar19) goto LAB_0021295c;
  goto LAB_00211c46;
}

Assistant:

void QMessagePattern::setPattern(const QString &pattern)
{
    timeArgs.clear();
#ifdef QLOGGING_HAVE_BACKTRACE
    backtraceArgs.clear();
    maxBacktraceDepth = 0;
#endif

    // scanner
    QList<QString> lexemes;
    QString lexeme;
    bool inPlaceholder = false;
    for (int i = 0; i < pattern.size(); ++i) {
        const QChar c = pattern.at(i);
        if (c == u'%' && !inPlaceholder) {
            if ((i + 1 < pattern.size())
                    && pattern.at(i + 1) == u'{') {
                // beginning of placeholder
                if (!lexeme.isEmpty()) {
                    lexemes.append(lexeme);
                    lexeme.clear();
                }
                inPlaceholder = true;
            }
        }

        lexeme.append(c);

        if (c == u'}' && inPlaceholder) {
            // end of placeholder
            lexemes.append(lexeme);
            lexeme.clear();
            inPlaceholder = false;
        }
    }
    if (!lexeme.isEmpty())
        lexemes.append(lexeme);

    // tokenizer
    std::vector<std::unique_ptr<const char[]>> literalsVar;
    tokens.reset(new const char *[lexemes.size() + 1]);
    tokens[lexemes.size()] = nullptr;

    bool nestedIfError = false;
    bool inIf = false;
    QString error;

    for (int i = 0; i < lexemes.size(); ++i) {
        const QString lexeme = lexemes.at(i);
        if (lexeme.startsWith("%{"_L1) && lexeme.endsWith(u'}')) {
            // placeholder
            if (lexeme == QLatin1StringView(typeTokenC)) {
                tokens[i] = typeTokenC;
            } else if (lexeme == QLatin1StringView(categoryTokenC))
                tokens[i] = categoryTokenC;
            else if (lexeme == QLatin1StringView(messageTokenC))
                tokens[i] = messageTokenC;
            else if (lexeme == QLatin1StringView(fileTokenC))
                tokens[i] = fileTokenC;
            else if (lexeme == QLatin1StringView(lineTokenC))
                tokens[i] = lineTokenC;
            else if (lexeme == QLatin1StringView(functionTokenC))
                tokens[i] = functionTokenC;
            else if (lexeme == QLatin1StringView(pidTokenC))
                tokens[i] = pidTokenC;
            else if (lexeme == QLatin1StringView(appnameTokenC))
                tokens[i] = appnameTokenC;
            else if (lexeme == QLatin1StringView(threadidTokenC))
                tokens[i] = threadidTokenC;
            else if (lexeme == QLatin1StringView(threadnameTokenC))
                tokens[i] = threadnameTokenC;
            else if (lexeme == QLatin1StringView(qthreadptrTokenC))
                tokens[i] = qthreadptrTokenC;
            else if (lexeme.startsWith(QLatin1StringView(timeTokenC))) {
                tokens[i] = timeTokenC;
                qsizetype spaceIdx = lexeme.indexOf(QChar::fromLatin1(' '));
                if (spaceIdx > 0)
                    timeArgs.append(lexeme.mid(spaceIdx + 1, lexeme.size() - spaceIdx - 2));
                else
                    timeArgs.append(QString());
            } else if (lexeme.startsWith(QLatin1StringView(backtraceTokenC))) {
#ifdef QLOGGING_HAVE_BACKTRACE
                tokens[i] = backtraceTokenC;
                QString backtraceSeparator = QStringLiteral("|");
                int backtraceDepth = 5;
                static const QRegularExpression depthRx(QStringLiteral(" depth=(?|\"([^\"]*)\"|([^ }]*))"));
                static const QRegularExpression separatorRx(QStringLiteral(" separator=(?|\"([^\"]*)\"|([^ }]*))"));
                QRegularExpressionMatch m = depthRx.match(lexeme);
                if (m.hasMatch()) {
                    int depth = m.capturedView(1).toInt();
                    if (depth <= 0)
                        error += "QT_MESSAGE_PATTERN: %{backtrace} depth must be a number greater than 0\n"_L1;
                    else
                        backtraceDepth = depth;
                }
                m = separatorRx.match(lexeme);
                if (m.hasMatch())
                    backtraceSeparator = m.captured(1);
                BacktraceParams backtraceParams;
                backtraceParams.backtraceDepth = backtraceDepth;
                backtraceParams.backtraceSeparator = backtraceSeparator;
                backtraceArgs.append(backtraceParams);
                maxBacktraceDepth = qMax(maxBacktraceDepth, backtraceDepth);
#else
                error += "QT_MESSAGE_PATTERN: %{backtrace} is not supported by this Qt build\n"_L1;
                tokens[i] = "";
#endif
            }

#define IF_TOKEN(LEVEL) \
            else if (lexeme == QLatin1StringView(LEVEL)) { \
                if (inIf) \
                    nestedIfError = true; \
                tokens[i] = LEVEL; \
                inIf = true; \
            }
            IF_TOKEN(ifCategoryTokenC)
            IF_TOKEN(ifDebugTokenC)
            IF_TOKEN(ifInfoTokenC)
            IF_TOKEN(ifWarningTokenC)
            IF_TOKEN(ifCriticalTokenC)
            IF_TOKEN(ifFatalTokenC)
#undef IF_TOKEN
            else if (lexeme == QLatin1StringView(endifTokenC)) {
                tokens[i] = endifTokenC;
                if (!inIf && !nestedIfError)
                    error += "QT_MESSAGE_PATTERN: %{endif} without an %{if-*}\n"_L1;
                inIf = false;
            } else {
                tokens[i] = emptyTokenC;
                error += "QT_MESSAGE_PATTERN: Unknown placeholder "_L1 + lexeme + '\n'_L1;
            }
        } else {
            using UP = std::unique_ptr<char[]>;
            tokens[i] = literalsVar.emplace_back(UP(qstrdup(lexeme.toLatin1().constData()))).get();
        }